

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

void __thiscall groundupdb::HashedValue::HashedValue(HashedValue *this,EncodedValue *from)

{
  size_t sVar1;
  
  this->_vptr_HashedValue = (_func_int **)&PTR__HashedValue_001384e8;
  this->m_has_value = from->m_has_value;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(&this->m_data,&(from->m_value).m_data);
  sVar1 = (from->m_value).m_hash;
  this->m_length = (from->m_value).m_length;
  this->m_hash = sVar1;
  return;
}

Assistant:

HashedValue::HashedValue(const EncodedValue& from)
  : m_has_value(from.hasValue()),
    m_data(from.data()),
    m_length(from.length()),
    m_hash(from.hash())
{
  ;
}